

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerWriteLargeSector(PgHdr *pPg)

{
  uint uVar1;
  Pager *pPager;
  bool bVar2;
  uint uVar3;
  int iVar4;
  DbPage *pPg_00;
  Pgno pgno;
  uint uVar5;
  u32 i;
  int iVar6;
  PgHdr *pPage;
  PgHdr *local_40;
  PgHdr *local_38;
  
  pPager = pPg->pPager;
  uVar1 = pPager->dbSize;
  uVar3 = pPager->sectorSize / (uint)pPager->pageSize;
  pPager->doNotSpill = pPager->doNotSpill | 4;
  uVar5 = pPg->pgno;
  pgno = -uVar3 & uVar5 - 1;
  if (uVar1 < uVar5) {
    uVar5 = uVar5 - pgno;
  }
  else {
    uVar5 = uVar1 - pgno;
    if (pgno + uVar3 <= uVar1) {
      uVar5 = uVar3;
    }
  }
  if ((int)uVar5 < 1) {
    iVar4 = 0;
  }
  else {
    bVar2 = false;
    iVar6 = 1;
    local_38 = pPg;
    do {
      i = pgno + iVar6;
      if (((i == local_38->pgno) || (pPager->pInJournal == (Bitvec *)0x0)) ||
         (iVar4 = sqlite3BitvecTestNotNull(pPager->pInJournal,i), iVar4 == 0)) {
        iVar4 = 0;
        if (i != sqlite3PendingByte / pPager->pageSize + 1U) {
          iVar4 = (*pPager->xGet)(pPager,i,&local_40,0);
          if (iVar4 == 0) {
            iVar4 = pager_write(local_40);
            if ((local_40->flags & 8) != 0) {
              bVar2 = true;
            }
            goto LAB_0013ba47;
          }
          goto LAB_0013ba9f;
        }
      }
      else {
        local_40 = sqlite3PagerLookup(pPager,i);
        iVar4 = 0;
        if (local_40 != (DbPage *)0x0) {
          if ((local_40->flags & 8) != 0) {
            bVar2 = true;
          }
LAB_0013ba47:
          sqlite3PagerUnrefNotNull(local_40);
        }
      }
    } while ((iVar6 < (int)uVar5) && (iVar6 = iVar6 + 1, iVar4 == 0));
    if ((iVar4 == 0) && ((bVar2 && (0 < (int)uVar5)))) {
      do {
        pgno = pgno + 1;
        pPg_00 = sqlite3PagerLookup(pPager,pgno);
        if (pPg_00 != (DbPage *)0x0) {
          *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
          sqlite3PagerUnrefNotNull(pPg_00);
        }
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
LAB_0013ba9f:
  pPager->doNotSpill = pPager->doNotSpill & 0xfb;
  return iVar4;
}

Assistant:

static SQLITE_NOINLINE int pagerWriteLargeSector(PgHdr *pPg){
  int rc = SQLITE_OK;          /* Return code */
  Pgno nPageCount;             /* Total number of pages in database file */
  Pgno pg1;                    /* First page of the sector pPg is located on. */
  int nPage = 0;               /* Number of pages starting at pg1 to journal */
  int ii;                      /* Loop counter */
  int needSync = 0;            /* True if any page has PGHDR_NEED_SYNC */
  Pager *pPager = pPg->pPager; /* The pager that owns pPg */
  Pgno nPagePerSector = (pPager->sectorSize/pPager->pageSize);

  /* Set the doNotSpill NOSYNC bit to 1. This is because we cannot allow
  ** a journal header to be written between the pages journaled by
  ** this function.
  */
  assert( !MEMDB );
  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)==0 );
  pPager->doNotSpill |= SPILLFLAG_NOSYNC;

  /* This trick assumes that both the page-size and sector-size are
  ** an integer power of 2. It sets variable pg1 to the identifier
  ** of the first page of the sector pPg is located on.
  */
  pg1 = ((pPg->pgno-1) & ~(nPagePerSector-1)) + 1;

  nPageCount = pPager->dbSize;
  if( pPg->pgno>nPageCount ){
    nPage = (pPg->pgno - pg1)+1;
  }else if( (pg1+nPagePerSector-1)>nPageCount ){
    nPage = nPageCount+1-pg1;
  }else{
    nPage = nPagePerSector;
  }
  assert(nPage>0);
  assert(pg1<=pPg->pgno);
  assert((pg1+nPage)>pPg->pgno);

  for(ii=0; ii<nPage && rc==SQLITE_OK; ii++){
    Pgno pg = pg1+ii;
    PgHdr *pPage;
    if( pg==pPg->pgno || !sqlite3BitvecTest(pPager->pInJournal, pg) ){
      if( pg!=PAGER_MJ_PGNO(pPager) ){
        rc = sqlite3PagerGet(pPager, pg, &pPage, 0);
        if( rc==SQLITE_OK ){
          rc = pager_write(pPage);
          if( pPage->flags&PGHDR_NEED_SYNC ){
            needSync = 1;
          }
          sqlite3PagerUnrefNotNull(pPage);
        }
      }
    }else if( (pPage = sqlite3PagerLookup(pPager, pg))!=0 ){
      if( pPage->flags&PGHDR_NEED_SYNC ){
        needSync = 1;
      }
      sqlite3PagerUnrefNotNull(pPage);
    }
  }

  /* If the PGHDR_NEED_SYNC flag is set for any of the nPage pages 
  ** starting at pg1, then it needs to be set for all of them. Because
  ** writing to any of these nPage pages may damage the others, the
  ** journal file must contain sync()ed copies of all of them
  ** before any of them can be written out to the database file.
  */
  if( rc==SQLITE_OK && needSync ){
    assert( !MEMDB );
    for(ii=0; ii<nPage; ii++){
      PgHdr *pPage = sqlite3PagerLookup(pPager, pg1+ii);
      if( pPage ){
        pPage->flags |= PGHDR_NEED_SYNC;
        sqlite3PagerUnrefNotNull(pPage);
      }
    }
  }

  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)!=0 );
  pPager->doNotSpill &= ~SPILLFLAG_NOSYNC;
  return rc;
}